

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::verifyTriangleGroupRasterization
               (Surface *surface,TriangleSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               VerificationMode mode)

{
  SceneTriangle *triangle;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int greenBits;
  int blueBits;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vec4 VVar5;
  Vec4 VVar6;
  bool bVar7;
  bool bVar8;
  int i;
  CoverageType CVar9;
  int iVar10;
  undefined4 uVar11;
  pointer pSVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  Surface *surface_00;
  long lVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ChannelOrder y;
  int iVar17;
  int iVar18;
  ChannelType z;
  long lVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  IVec2 viewportSize;
  Vector<float,_2> res;
  RGBA triangleColor;
  RGBA backGroundColor;
  Surface errorMask;
  Vector<float,_2> res_5;
  Vector<float,_2> res_6;
  Vector<float,_2> res_3;
  Vector<float,_2> res_4;
  Vector<float,_2> res_1;
  TextureLevel coverageMap;
  Vec2 screenSpace [3];
  Vec2 normalizedDeviceSpace [3];
  IVec2 local_450;
  undefined1 local_448 [16];
  string local_438;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string local_3f8;
  VerificationMode local_3d8;
  float local_3d4;
  int local_3d0;
  int local_3cc;
  RGBA local_3c8;
  RGBA local_3c4;
  Surface local_3c0;
  float local_3a8 [5];
  float local_394;
  float local_390;
  float local_38c;
  undefined1 local_388 [16];
  string local_370;
  string local_350;
  LogImageSet local_330;
  TextureLevel local_2f0;
  undefined1 local_2c8 [8];
  ulong uStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Alloc_hider local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [6];
  string local_238;
  undefined1 local_218 [16];
  RasterizationArguments *local_200;
  long local_1f8;
  float local_1f0 [2];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  float local_1c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [4];
  ios_base local_150 [264];
  undefined1 local_48 [16];
  
  local_3c4.m_value = 0xff000000;
  local_3c8.m_value = 0xffffffff;
  iVar10 = args->numSamples;
  local_450.m_data[0] = surface->m_width;
  local_450.m_data[1] = surface->m_height;
  iVar17 = args->subpixelBits;
  local_1c8._0_4_ = R;
  local_1c8._4_4_ = UNSIGNED_INT8;
  local_3d8 = mode;
  local_200 = args;
  TextureLevel::TextureLevel
            (&local_2f0,(TextureFormat *)local_1c8,local_450.m_data[0],local_450.m_data[1],1);
  Surface::Surface(&local_3c0,surface->m_width,surface->m_height);
  if (iVar17 < 0) {
    local_1c8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"Invalid subpixel count (",0x18);
    std::ostream::operator<<((ostringstream *)local_1c0,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"), assuming 0",0xd);
    MessageBuilder::operator<<((MessageBuilder *)local_1c8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    iVar17 = 0;
  }
  else if (0x10 < iVar17) {
    local_1c8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"Subpixel count is greater than 16 (",0x23);
    std::ostream::operator<<((ostringstream *)local_1c0,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "). Checking results using less strict 16 bit requirements. This may produce false positives."
               ,0x5c);
    MessageBuilder::operator<<((MessageBuilder *)local_1c8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    iVar17 = 0x10;
  }
  TextureLevel::getAccess((PixelBufferAccess *)local_1c8,&local_2f0);
  _local_2c8 = ZEXT812(2);
  uStack_2c0._4_4_ = 0.0;
  clear((PixelBufferAccess *)local_1c8,(IVec4 *)local_2c8);
  pSVar12 = (scene->triangles).
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(scene->triangles).
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar12) >> 2) *
          -0x3d70a3d7) {
    lVar16 = 0;
    local_3d0 = iVar10;
    local_3cc = iVar17;
    do {
      local_1f8 = lVar16 * 100;
      fVar21 = *(float *)((long)pSVar12[lVar16].positions[0].m_data + 0xc);
      local_1c8._4_4_ = *(float *)((long)pSVar12[lVar16].positions[0].m_data + 4) / fVar21;
      local_1c8._0_4_ = pSVar12[lVar16].positions[0].m_data[0] / fVar21;
      fVar21 = *(float *)((long)(pSVar12[lVar16].positions + 1) + 0xc);
      local_1c0[0] = pSVar12[lVar16].positions[1].m_data[0] / fVar21;
      local_1c0[1] = *(float *)((long)(pSVar12[lVar16].positions + 1) + 4) / fVar21;
      fVar21 = *(float *)((long)(pSVar12[lVar16].positions + 2) + 0xc);
      local_1b8._M_allocated_capacity._0_4_ = pSVar12[lVar16].positions[2].m_data[0] / fVar21;
      local_1b8._M_allocated_capacity._4_4_ =
           *(float *)((long)(pSVar12[lVar16].positions + 2) + 4) / fVar21;
      local_3f8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
      local_438._M_dataplus._M_p = (pointer)0x0;
      lVar13 = 0;
      do {
        *(float *)((long)&local_438._M_dataplus._M_p + lVar13 * 4) =
             *(float *)(local_1c8 + lVar13 * 4) +
             *(float *)((long)&local_3f8._M_dataplus._M_p + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_330.m_name._M_dataplus._M_p = (pointer)0x0;
      lVar13 = 0;
      do {
        *(float *)((long)&local_330.m_name._M_dataplus._M_p + lVar13 * 4) =
             *(float *)((long)&local_438._M_dataplus._M_p + lVar13 * 4) * 0.5;
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_418._0_4_ = (undefined4)local_450.m_data[0];
      local_418._4_4_ = (undefined4)local_450.m_data[1];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uStack_2c0;
      _local_2c8 = (float  [4])(auVar2 << 0x40);
      lVar13 = 0;
      do {
        *(float *)(local_2c8 + lVar13 * 4) =
             *(float *)((long)&local_330.m_name._M_dataplus._M_p + lVar13 * 4) *
             *(float *)(local_418 + lVar13 * 4);
        VVar5.m_data = _local_2c8;
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_238._M_dataplus._M_p = (pointer)0x3f8000003f800000;
      local_370._M_dataplus._M_p = (pointer)0x0;
      lVar13 = 0;
      do {
        *(float *)((long)&local_370._M_dataplus._M_p + lVar13 * 4) =
             local_1c0[lVar13] + *(float *)((long)&local_238._M_dataplus._M_p + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_350._M_dataplus._M_p = (pointer)0x0;
      lVar13 = 0;
      do {
        *(float *)((long)&local_350._M_dataplus._M_p + lVar13 * 4) =
             *(float *)((long)&local_370._M_dataplus._M_p + lVar13 * 4) * 0.5;
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_390 = (float)local_418._0_4_;
      local_38c = (float)local_418._4_4_;
      uStack_2c0._0_4_ = 0.0;
      uStack_2c0._4_4_ = 0.0;
      VVar6.m_data = _local_2c8;
      lVar13 = 0;
      do {
        *(float *)(local_2c8 + lVar13 * 4 + 8) =
             *(float *)((long)&local_350._M_dataplus._M_p + lVar13 * 4) * local_3a8[lVar13 + 6];
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_1f0[0] = 1.0;
      local_1f0[1] = 1.0;
      local_3a8[0] = 0.0;
      local_3a8[1] = 0.0;
      lVar13 = 0;
      do {
        local_3a8[lVar13] =
             *(float *)((long)&local_1b8 + lVar13 * 4) + *(float *)(local_1e8 + lVar13 * 4 + -8);
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_3a8[2] = 0.0;
      local_3a8[3] = 0.0;
      lVar13 = 0;
      do {
        local_3a8[lVar13 + 2] = local_3a8[lVar13] * 0.5;
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_3a8[4] = (float)local_418._0_4_;
      local_394 = (float)local_418._4_4_;
      local_2b8._M_allocated_capacity = 0;
      lVar13 = 0;
      do {
        *(float *)((long)&local_2b8 + lVar13 * 4) = local_3a8[lVar13 + 2] * local_3a8[lVar13 + 4];
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      local_2c8._0_4_ = VVar5.m_data[0];
      local_1d8 = ZEXT416((uint)local_2c8._0_4_);
      local_2c8._4_4_ = VVar5.m_data[1];
      local_448 = ZEXT416((uint)local_2c8._4_4_);
      local_1e8 = ZEXT416(0);
      local_388 = ZEXT416((uint)local_2b8._M_allocated_capacity._0_4_);
      local_218 = ZEXT416(0);
      fVar21 = (float)(-(uint)((float)local_2c8._4_4_ <= 0.0) & local_2c8._4_4_);
      local_48 = ZEXT416((uint)local_2b8._M_allocated_capacity._4_4_);
      uVar20 = -(uint)(fVar21 <= (float)local_2b8._M_allocated_capacity._4_4_);
      _local_2c8 = VVar6.m_data;
      fVar21 = floorf((float)(~uVar20 & local_2b8._M_allocated_capacity._4_4_ |
                             uVar20 & (uint)fVar21));
      fVar22 = (float)(~-(uint)((float)local_1e8._0_4_ <= (float)local_1d8._0_4_) & local_1e8._0_4_
                      | -(uint)((float)local_1e8._0_4_ <= (float)local_1d8._0_4_) & local_1d8._0_4_)
      ;
      uVar20 = -(uint)((float)local_388._0_4_ <= fVar22);
      local_3d4 = ceilf((float)(~uVar20 & local_388._0_4_ | uVar20 & (uint)fVar22));
      fVar22 = (float)(~-(uint)((float)local_218._0_4_ <= (float)local_448._0_4_) & local_218._0_4_
                      | local_448._0_4_ & -(uint)((float)local_218._0_4_ <= (float)local_448._0_4_))
      ;
      uVar20 = -(uint)((float)local_48._0_4_ <= fVar22);
      fVar22 = ceilf((float)(~uVar20 & local_48._0_4_ | uVar20 & (uint)fVar22));
      iVar15 = (int)fVar22;
      z = (int)fVar21;
      if ((int)fVar21 < 1) {
        z = SNORM_INT8;
      }
      local_218._0_4_ = iVar15;
      iVar18 = local_2f0.m_size.m_data[1] + -1;
      if (iVar15 < local_2f0.m_size.m_data[1] + -1) {
        iVar18 = iVar15;
      }
      if ((int)z <= iVar18) {
        local_448._0_4_ = (int)local_3d4;
        fVar21 = (float)(~-(uint)((float)local_1d8._0_4_ <= (float)local_1e8._0_4_) &
                         local_1e8._0_4_ |
                        local_1d8._0_4_ & -(uint)((float)local_1d8._0_4_ <= (float)local_1e8._0_4_))
        ;
        uVar20 = -(uint)(fVar21 <= (float)local_388._0_4_);
        fVar21 = floorf((float)(~uVar20 & local_388._0_4_ | uVar20 & (uint)fVar21));
        iVar15 = (int)fVar21;
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        local_388._0_4_ = iVar15;
        do {
          iVar15 = local_2f0.m_size.m_data[0] + -1;
          if ((int)local_448._0_4_ < local_2f0.m_size.m_data[0] + -1) {
            iVar15 = local_448._0_4_;
          }
          y = local_388._0_4_;
          if ((int)local_388._0_4_ <= iVar15) {
            do {
              TextureLevel::getAccess((PixelBufferAccess *)local_1c8,&local_2f0);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_2c8,(int)(PixelBufferAccess *)local_1c8,y,z
                        );
              if ((float)local_2c8._0_4_ != 0.0) {
                pSVar12 = (scene->triangles).
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                triangle = (SceneTriangle *)((long)pSVar12->positions[0].m_data + local_1f8);
                local_1c8._4_4_ = z;
                local_1c8._0_4_ = y;
                CVar9 = calculateTriangleCoverage
                                  ((Vec4 *)triangle,
                                   (Vec4 *)((long)(pSVar12->positions + 1) + local_1f8),
                                   (Vec4 *)((long)(pSVar12->positions + 2) + local_1f8),
                                   (IVec2 *)local_1c8,&local_450,iVar17,iVar10 != 0);
                if (CVar9 == COVERAGE_PARTIAL) {
                  bVar7 = anon_unknown_3::pixelOnlyOnASharedEdge
                                    ((IVec2 *)local_1c8,triangle,&local_450);
                  uVar20 = 1;
                  if (bVar7) {
                    pSVar12 = (scene->triangles).
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    iVar10 = (int)((ulong)((long)(scene->triangles).
                                                 super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pSVar12) >> 2) * -0x3d70a3d7;
                    bVar7 = iVar10 < 1;
                    if (0 < iVar10) {
                      lVar19 = 0;
                      lVar13 = 0;
                      do {
                        if (lVar16 != lVar13) {
                          bVar8 = anon_unknown_3::pixelOnlyOnASharedEdge
                                            ((IVec2 *)local_1c8,
                                             (SceneTriangle *)
                                             ((long)pSVar12->positions[0].m_data + lVar19),
                                             &local_450);
                          if (bVar8) break;
                        }
                        lVar13 = lVar13 + 1;
                        pSVar12 = (scene->triangles).
                                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        lVar14 = (long)((int)((ulong)((long)(scene->triangles).
                                                                                                                        
                                                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pSVar12) >> 2) * -0x3d70a3d7);
                        lVar19 = lVar19 + 100;
                        bVar7 = lVar14 <= lVar13;
                      } while (lVar13 < lVar14);
                    }
                    uVar20 = (uint)bVar7;
                    iVar10 = local_3d0;
                  }
                  TextureLevel::getAccess((PixelBufferAccess *)local_1c8,&local_2f0);
                  _local_2c8 = (float  [4])ZEXT416(uVar20);
                  PixelBufferAccess::setPixel
                            ((PixelBufferAccess *)local_1c8,(IVec4 *)local_2c8,y,z,0);
                  iVar17 = local_3cc;
                }
                else if (CVar9 == COVERAGE_FULL) {
                  TextureLevel::getAccess((PixelBufferAccess *)local_1c8,&local_2f0);
                  _local_2c8 = (float  [4])ZEXT816(0);
                  PixelBufferAccess::setPixel
                            ((PixelBufferAccess *)local_1c8,(IVec4 *)local_2c8,y,z,0);
                }
              }
              y = y + A;
              iVar15 = local_2f0.m_size.m_data[0] + -1;
              if ((int)local_448._0_4_ < local_2f0.m_size.m_data[0] + -1) {
                iVar15 = local_448._0_4_;
              }
            } while ((int)y <= iVar15);
          }
          z = z + SNORM_INT16;
          iVar15 = local_2f0.m_size.m_data[1] + -1;
          if ((int)local_218._0_4_ < local_2f0.m_size.m_data[1] + -1) {
            iVar15 = local_218._0_4_;
          }
        } while ((int)z <= iVar15);
      }
      lVar16 = lVar16 + 1;
      pSVar12 = (scene->triangles).
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar16 < (int)((ulong)((long)(scene->triangles).
                                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar12
                                   ) >> 2) * -0x3d70a3d7);
  }
  local_2c8._0_4_ = RGBA;
  local_2c8._4_4_ = UNORM_INT8;
  if ((void *)local_3c0.m_pixels.m_cap != (void *)0x0) {
    local_3c0.m_pixels.m_cap = (size_t)local_3c0.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1c8,(TextureFormat *)local_2c8,local_3c0.m_width,
             local_3c0.m_height,1,(void *)local_3c0.m_pixels.m_cap);
  _local_2c8 = (float  [4])(ZEXT816(0x3f80000000000000) << 0x40);
  clear((PixelBufferAccess *)local_1c8,(Vec4 *)local_2c8);
  if (surface->m_height < 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_448._8_8_;
    local_448 = auVar4 << 0x40;
    iVar10 = 0;
  }
  else {
    iVar17 = 0;
    iVar10 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_448._8_8_;
    local_448 = auVar3 << 0x40;
    do {
      iVar15 = surface->m_width;
      if (0 < iVar15) {
        iVar18 = 0;
        do {
          local_330.m_name._M_dataplus._M_p._0_4_ =
               *(undefined4 *)
                ((long)(surface->m_pixels).m_ptr + (long)(iVar15 * iVar17 + iVar18) * 4);
          iVar15 = local_200->redBits;
          greenBits = local_200->greenBits;
          blueBits = local_200->blueBits;
          bVar7 = anon_unknown_3::compareColors
                            ((RGBA *)&local_330,&local_3c4,iVar15,greenBits,blueBits);
          bVar8 = anon_unknown_3::compareColors
                            ((RGBA *)&local_330,&local_3c8,iVar15,greenBits,blueBits);
          TextureLevel::getAccess((PixelBufferAccess *)local_1c8,&local_2f0);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_2c8,(int)(PixelBufferAccess *)local_1c8,iVar18,
                     iVar17);
          auVar2 = local_448;
          iVar15 = iVar10;
          if ((float)local_2c8._0_4_ == 0.0) {
            uVar11 = 0xffff00ff;
            if (bVar8) {
              uVar11 = 0xff1e1e1e;
            }
            iVar15 = iVar10 + 1;
            if (bVar8) {
              iVar15 = iVar10;
            }
LAB_00acfc0d:
            *(undefined4 *)
             ((long)local_3c0.m_pixels.m_ptr + (long)(local_3c0.m_width * iVar17 + iVar18) * 4) =
                 uVar11;
            iVar10 = iVar15;
          }
          else {
            if ((float)local_2c8._0_4_ == 1.4013e-45) {
              uVar11 = 0xff00ffff;
              goto LAB_00acfc0d;
            }
            if (((float)local_2c8._0_4_ == 2.8026e-45) && (!bVar7)) {
              iVar10 = local_448._0_4_;
              local_448._4_4_ = 0;
              local_448._0_4_ = iVar10 + 1;
              local_448._8_8_ = auVar2._8_8_;
              uVar11 = 0xff0000ff;
              goto LAB_00acfc0d;
            }
          }
          iVar18 = iVar18 + 1;
          iVar15 = surface->m_width;
        } while (iVar18 < iVar15);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < surface->m_height);
  }
  local_1c8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"Verifying rasterization result.",0x1f);
  auVar2 = local_448;
  MessageBuilder::operator<<((MessageBuilder *)local_1c8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  iVar17 = auVar2._0_4_;
  iVar15 = (int)log;
  if (local_3d8 == VERIFICATIONMODE_WEAK) {
    if (10 < iVar10 + iVar17) goto LAB_00acfcee;
  }
  else if ((local_3d8 == VERIFICATIONMODE_STRICT) && (0 < iVar10 + iVar17)) {
LAB_00acfcee:
    local_1c8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"Invalid pixels found:\n\t",0x17);
    std::ostream::operator<<((ostringstream *)local_1c0,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0," missing pixels. (Marked with purple)\n\t",0x27);
    std::ostream::operator<<((ostringstream *)local_1c0,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0," incorrectly filled pixels. (Marked with red)\n\t",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"Unknown (subpixel on edge) pixels are marked with yellow.",0x39
              );
    MessageBuilder::operator<<((MessageBuilder *)local_1c8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Verification result","");
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"Result of rendering","");
    LogImageSet::LogImageSet(&local_330,&local_438,&local_3f8);
    TestLog::startImageSet
              (log,local_330.m_name._M_dataplus._M_p,local_330.m_description._M_dataplus._M_p);
    local_418._0_8_ = &local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Result","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Result","");
    LogImage::LogImage((LogImage *)local_1c8,(string *)local_418,&local_350,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1c8,iVar15,__buf,(size_t)surface);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"ErrorMask","");
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"ErrorMask","");
    surface_00 = &local_3c0;
    LogImage::LogImage((LogImage *)local_2c8,&local_370,&local_238,surface_00,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_2c8,iVar15,__buf_00,(size_t)surface_00);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_p != local_298) {
      operator_delete(local_2a8._M_p,local_298[0]._M_allocated_capacity + 1);
    }
    if (local_2c8 != (undefined1  [8])&local_2b8) {
      operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != local_198) {
      operator_delete(local_1a8._M_p,local_198[0]._M_allocated_capacity + 1);
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,
                      CONCAT44(local_1b8._M_allocated_capacity._4_4_,
                               local_1b8._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._0_8_ != &local_408) {
      operator_delete((void *)local_418._0_8_,local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.m_description._M_dataplus._M_p != &local_330.m_description.field_2) {
      operator_delete(local_330.m_description._M_dataplus._M_p,
                      local_330.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
      operator_delete(local_330.m_name._M_dataplus._M_p,
                      local_330.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    bVar7 = false;
    goto LAB_00ad02ee;
  }
  local_1c8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"No invalid pixels found.",0x18);
  MessageBuilder::operator<<((MessageBuilder *)local_1c8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  paVar1 = &local_330.m_name.field_2;
  local_330.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Verification result","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Result of rendering","");
  LogImageSet::LogImageSet((LogImageSet *)local_2c8,&local_330.m_name,&local_438);
  TestLog::startImageSet(log,(char *)local_2c8,local_2a8._M_p);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"Result","");
  local_418._0_8_ = &local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Result","");
  LogImage::LogImage((LogImage *)local_1c8,&local_3f8,(string *)local_418,surface,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  LogImage::write((LogImage *)local_1c8,iVar15,__buf_01,(size_t)surface);
  TestLog::endImageSet(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != local_198) {
    operator_delete(local_1a8._M_p,local_198[0]._M_allocated_capacity + 1);
  }
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,
                    CONCAT44(local_1b8._M_allocated_capacity._4_4_,
                             local_1b8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != &local_408) {
    operator_delete((void *)local_418._0_8_,local_408._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != local_298) {
    operator_delete(local_2a8._M_p,local_298[0]._M_allocated_capacity + 1);
  }
  if (local_2c8 != (undefined1  [8])&local_2b8) {
    operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_330.m_name._M_dataplus._M_p,
                    local_330.m_name.field_2._M_allocated_capacity + 1);
  }
  bVar7 = true;
LAB_00ad02ee:
  Surface::~Surface(&local_3c0);
  TextureLevel::~TextureLevel(&local_2f0);
  return bVar7;
}

Assistant:

bool verifyTriangleGroupRasterization (const tcu::Surface& surface, const TriangleSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, VerificationMode mode)
{
	DE_ASSERT(mode < VERIFICATIONMODE_LAST);

	const tcu::RGBA		backGroundColor				= tcu::RGBA(0, 0, 0, 255);
	const tcu::RGBA		triangleColor				= tcu::RGBA(255, 255, 255, 255);
	const tcu::RGBA		missingPixelColor			= tcu::RGBA(255, 0, 255, 255);
	const tcu::RGBA		unexpectedPixelColor		= tcu::RGBA(255, 0, 0, 255);
	const tcu::RGBA		partialPixelColor			= tcu::RGBA(255, 255, 0, 255);
	const tcu::RGBA		primitivePixelColor			= tcu::RGBA(30, 30, 30, 255);
	const int			weakVerificationThreshold	= 10;
	const bool			multisampled				= (args.numSamples != 0);
	const tcu::IVec2	viewportSize				= tcu::IVec2(surface.getWidth(), surface.getHeight());
	int					missingPixels				= 0;
	int					unexpectedPixels			= 0;
	int					subPixelBits				= args.subpixelBits;
	tcu::TextureLevel	coverageMap					(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());
	tcu::Surface		errorMask					(surface.getWidth(), surface.getHeight());

	// subpixel bits in in a valid range?

	if (subPixelBits < 0)
	{
		log << tcu::TestLog::Message << "Invalid subpixel count (" << subPixelBits << "), assuming 0" << tcu::TestLog::EndMessage;
		subPixelBits = 0;
	}
	else if (subPixelBits > 16)
	{
		// At high subpixel bit counts we might overflow. Checking at lower bit count is ok, but is less strict
		log << tcu::TestLog::Message << "Subpixel count is greater than 16 (" << subPixelBits << "). Checking results using less strict 16 bit requirements. This may produce false positives." << tcu::TestLog::EndMessage;
		subPixelBits = 16;
	}

	// generate coverage map

	tcu::clear(coverageMap.getAccess(), tcu::IVec4(COVERAGE_NONE, 0, 0, 0));

	for (int triNdx = 0; triNdx < (int)scene.triangles.size(); ++triNdx)
	{
		const tcu::IVec4 aabb = getTriangleAABB(scene.triangles[triNdx], viewportSize);

		for (int y = de::max(0, aabb.y()); y <= de::min(aabb.w(), coverageMap.getHeight() - 1); ++y)
		for (int x = de::max(0, aabb.x()); x <= de::min(aabb.z(), coverageMap.getWidth() - 1); ++x)
		{
			if (coverageMap.getAccess().getPixelUint(x, y).x() == COVERAGE_FULL)
				continue;

			const CoverageType coverage = calculateTriangleCoverage(scene.triangles[triNdx].positions[0],
																	scene.triangles[triNdx].positions[1],
																	scene.triangles[triNdx].positions[2],
																	tcu::IVec2(x, y),
																	viewportSize,
																	subPixelBits,
																	multisampled);

			if (coverage == COVERAGE_FULL)
			{
				coverageMap.getAccess().setPixel(tcu::IVec4(COVERAGE_FULL, 0, 0, 0), x, y);
			}
			else if (coverage == COVERAGE_PARTIAL)
			{
				CoverageType resultCoverage = COVERAGE_PARTIAL;

				// Sharing an edge with another triangle?
				// There should always be such a triangle, but the pixel in the other triangle might be
				// on multiple edges, some of which are not shared. In these cases the coverage cannot be determined.
				// Assume full coverage if the pixel is only on a shared edge in shared triangle too.
				if (pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[triNdx], viewportSize))
				{
					bool friendFound = false;
					for (int friendTriNdx = 0; friendTriNdx < (int)scene.triangles.size(); ++friendTriNdx)
					{
						if (friendTriNdx != triNdx && pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[friendTriNdx], viewportSize))
						{
							friendFound = true;
							break;
						}
					}

					if (friendFound)
						resultCoverage = COVERAGE_FULL;
				}

				coverageMap.getAccess().setPixel(tcu::IVec4(resultCoverage, 0, 0, 0), x, y);
			}
		}
	}

	// check pixels

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (int y = 0; y < surface.getHeight(); ++y)
	for (int x = 0; x < surface.getWidth(); ++x)
	{
		const tcu::RGBA		color				= surface.getPixel(x, y);
		const bool			imageNoCoverage		= compareColors(color, backGroundColor, args.redBits, args.greenBits, args.blueBits);
		const bool			imageFullCoverage	= compareColors(color, triangleColor, args.redBits, args.greenBits, args.blueBits);
		CoverageType		referenceCoverage	= (CoverageType)coverageMap.getAccess().getPixelUint(x, y).x();

		switch (referenceCoverage)
		{
			case COVERAGE_NONE:
				if (!imageNoCoverage)
				{
					// coverage where there should not be
					++unexpectedPixels;
					errorMask.setPixel(x, y, unexpectedPixelColor);
				}
				break;

			case COVERAGE_PARTIAL:
				// anything goes
				errorMask.setPixel(x, y, partialPixelColor);
				break;

			case COVERAGE_FULL:
				if (!imageFullCoverage)
				{
					// no coverage where there should be
					++missingPixels;
					errorMask.setPixel(x, y, missingPixelColor);
				}
				else
				{
					errorMask.setPixel(x, y, primitivePixelColor);
				}
				break;

			default:
				DE_ASSERT(false);
		};
	}

	// Output results
	log << tcu::TestLog::Message << "Verifying rasterization result." << tcu::TestLog::EndMessage;

	if (((mode == VERIFICATIONMODE_STRICT) && (missingPixels + unexpectedPixels > 0)) ||
		((mode == VERIFICATIONMODE_WEAK)   && (missingPixels + unexpectedPixels > weakVerificationThreshold)))
	{
		log << tcu::TestLog::Message << "Invalid pixels found:\n\t"
			<< missingPixels << " missing pixels. (Marked with purple)\n\t"
			<< unexpectedPixels << " incorrectly filled pixels. (Marked with red)\n\t"
			<< "Unknown (subpixel on edge) pixels are marked with yellow."
			<< tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result",	"Result",		surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}